

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O3

void test_contains_all(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *bitset_00;
  size_t shiftedi;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  bitset = bitset_create();
  uVar3 = 0;
  bitset_00 = bitset_create();
  do {
    uVar2 = uVar3 >> 6;
    if (uVar2 < bitset->arraysize) {
LAB_0010371d:
      bitset->array[uVar2] = bitset->array[uVar2] | 1L << ((byte)uVar3 & 0x3f);
    }
    else {
      _Var1 = bitset_grow(bitset,uVar2 + 1);
      if (_Var1) goto LAB_0010371d;
    }
    if ((uVar3 & 1) == 0) {
      if (bitset_00->arraysize <= uVar2) {
        _Var1 = bitset_grow(bitset_00,uVar2 + 1);
        if (!_Var1) goto LAB_00103761;
      }
      bitset_00->array[uVar2] = bitset_00->array[uVar2] | 1L << ((byte)uVar3 & 0x3e);
    }
LAB_00103761:
    uVar3 = uVar3 + 1;
  } while (uVar3 != 1000);
  _Var1 = bitset_contains_all(bitset,bitset_00);
  _assert_true((ulong)_Var1,"bitset_contains_all(superset, subset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x118);
  _Var1 = bitset_contains_all(bitset_00,bitset);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(subset, superset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x119);
  if (bitset_00->arraysize < 0x10) {
    _Var1 = bitset_grow(bitset_00,0x10);
    if (!_Var1) goto LAB_001037e3;
  }
  bitset_00->array[0xf] = bitset_00->array[0xf] | 0x20000000000;
LAB_001037e3:
  _Var1 = bitset_contains_all(bitset,bitset_00);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(superset, subset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x11d);
  _Var1 = bitset_contains_all(bitset_00,bitset);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(subset, superset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x11e);
  bitset_free(bitset);
  bitset_free(bitset_00);
  return;
}

Assistant:

DEFINE_TEST(test_contains_all) {
    bitset_t *superset = bitset_create();
    bitset_t *subset = bitset_create();

    for (int i = 0; i < 1000; i++) {
        bitset_set(superset, i);
        if (i % 2 == 0) bitset_set(subset, i);
    }

    assert_true(bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_set(subset, 1001);

    assert_true(!bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_free(superset);
    bitset_free(subset);
}